

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall slang::ast::Scope::elaborate(Scope *this)

{
  string_view *key;
  SymbolKind SVar1;
  SyntaxKind SVar2;
  ClassType *this_00;
  Compilation *pCVar3;
  ExpressionSyntax *pEVar4;
  pointer this_01;
  ForwardingTypedefSymbol *pFVar5;
  SymbolMap *pSVar6;
  GenericClassDefSymbol *this_02;
  StatementBlockSymbol *this_03;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  portDeclarations;
  Compilation **ppCVar7;
  undefined1 auVar8 [8];
  undefined8 uVar9;
  int iVar10;
  DeferredMemberData *pDVar11;
  DeclaredType *this_04;
  Type *pTVar12;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> args;
  TransparentMemberSymbol *pTVar13;
  EnumTypeSyntax *syntax;
  GenerateBlockSyntax *syntax_00;
  GenerateBlockSymbol *member;
  BindDirectiveSyntax *syntax_01;
  IfGenerateSyntax *syntax_02;
  ClockingItemSyntax *syntax_03;
  ModportDeclarationSyntax *syntax_04;
  PortSymbol *this_05;
  undefined4 extraout_var;
  Scope *extraout_RAX;
  Scope *pSVar14;
  DefaultClockingReferenceSyntax *syntax_05;
  DefaultDisableDeclarationSyntax *pDVar15;
  undefined4 extraout_var_00;
  PrimitiveInstantiationSyntax *syntax_06;
  HierarchyInstantiationSyntax *syntax_07;
  CaseGenerateSyntax *syntax_08;
  LoopGenerateSyntax *syntax_09;
  GenerateBlockArraySymbol *member_00;
  ContinuousAssignSyntax *syntax_10;
  ModuleDeclarationSyntax *syntax_11;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *pSVar16;
  PortDeclarationSyntax *pPVar17;
  DataDeclarationSyntax *pDVar18;
  DeclaratorSyntax *this_06;
  Symbol *pSVar19;
  iterator iVar20;
  Diagnostic *pDVar21;
  logic_error *this_07;
  long *plVar22;
  byte bVar23;
  size_type *psVar24;
  SyntaxNode *pSVar25;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  Symbol *extraout_RDX_02;
  Symbol *pSVar26;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range4;
  pointer ppSVar27;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_08;
  size_t index;
  Symbol *pSVar28;
  Symbol *pSVar29;
  Symbol **ppSVar30;
  TransparentMemberSymbol *at_00;
  long lVar31;
  long lVar32;
  ulong uVar33;
  pointer ppFVar34;
  pointer ppVar35;
  span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB;
  function_ref<void_(const_slang::ast::Symbol_&)> insertCB_00;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  pair<ska::detailv3::sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>::templated_iterator<const_slang::syntax::SyntaxNode_*>,_bool>
  pVar36;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_> iVar37;
  LookupLocation LVar38;
  string_view sVar39;
  SourceRange sourceRange;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar40;
  SmallVector<const_slang::ast::Symbol_*,_5UL> ports;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  observedForwardDecls;
  Symbol *at;
  DeferredMemberData deferredData;
  SmallSet<const_slang::syntax::SyntaxNode_*,_8UL,_ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  enumDecls;
  pointer in_stack_fffffffffffffcd8;
  char *local_318;
  undefined1 local_308 [8];
  Symbol *local_300;
  undefined1 local_2f8 [16];
  TempVarSymbol *local_2e8;
  Symbol *pSStack_2e0;
  AssertionInstanceDetails *local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  Scope SStack_2b0;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
  *local_268;
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
  local_260;
  pointer local_238;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  ulong local_208;
  undefined1 local_200 [56];
  SyntaxNode *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  DeferredMemberData local_1a0;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Scope *local_e0 [16];
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
  *local_60;
  sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
  local_58;
  Expression *expr;
  
  if ((this->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
    detail.callable = (intptr_t)local_e0;
    detail.callback =
         function_ref<std::__cxx11::string()>::callback_fn<slang::ast::Scope::elaborate()const::__2>
    ;
    sVar39._M_str = "elaborate scope";
    sVar39._M_len = 0xf;
    local_e0[0] = this;
    TimeTrace::beginTrace(sVar39,detail);
  }
  if (this->deferredMemberIndex == Invalid) {
    assert::assertFailed
              ("deferredMemberIndex != DeferredMemberIndex::Invalid",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
               ,0x326,"void slang::ast::Scope::elaborate() const");
  }
  local_1c8 = (SyntaxNode *)&this->deferredMemberIndex;
  pDVar11 = Compilation::getOrAddDeferredData(this->compilation,(DeferredMemberIndex *)local_1c8);
  DeferredMemberData::DeferredMemberData(&local_1a0,pDVar11);
  this->deferredMemberIndex = Invalid;
  local_60 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>
              *)local_e0;
  local_58.
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>.
  storage = local_60;
  local_58.entries = ska::detailv3::empty_default_table<slang::syntax::SyntaxNode_const*>();
  local_58.num_slots_minus_one = 0;
  local_58.hash_policy.shift = '?';
  local_58.max_lookups = '\x03';
  local_58._max_load_factor = 0.5;
  local_58.num_elements = 0;
  if (local_1a0.transparentTypes.
      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1a0.transparentTypes.
      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_318 = "type->kind == SymbolKind::ErrorType";
    ppVar35 = local_1a0.transparentTypes.
              super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      at_00 = (TransparentMemberSymbol *)ppVar35->first;
      this_04 = Symbol::getDeclaredType(ppVar35->second);
      pTVar12 = DeclaredType::getType(this_04);
      while( true ) {
        if (pTVar12->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar12);
        }
        if ((pTVar12->canonical->super_Symbol).kind != PackedArrayType) break;
        pTVar12 = Type::getArrayElementType(pTVar12);
      }
      SVar1 = (pTVar12->super_Symbol).kind;
      if (SVar1 == EnumType) {
        pSVar14 = (Scope *)(pTVar12->super_Symbol).originatingSyntax;
        if ((pSVar14 == (Scope *)0x0) ||
           (local_2c8._0_8_ = pSVar14,
           pVar36 = ska::detailv3::
                    sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                    ::emplace<slang::syntax::SyntaxNode_const*>
                              ((sherwood_v3_table<slang::syntax::SyntaxNode_const*,slang::syntax::SyntaxNode_const*,std::hash<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::SyntaxNode_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::SyntaxNode_const*>,8ul>>
                                *)&local_58,(SyntaxNode **)local_2c8),
           ((undefined1  [16])pVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          if ((pTVar12->super_Symbol).kind != EnumType) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::EnumType]");
          }
          iVar37 = membersOfType<slang::ast::EnumValueSymbol>
                             ((Scope *)&pTVar12[1].super_Symbol.name);
          args = iVar37.m_begin.current;
LAB_0026f993:
          if (args.current != iVar37.m_end.current.current) {
            if ((((EnumValueSymbol *)args.current)->super_ValueSymbol).super_Symbol.kind !=
                EnumValue) {
              assert::assertFailed
                        ("T::isKind(kind)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                         ,0xc4,
                         "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::EnumValueSymbol]"
                        );
            }
            pSVar14 = this;
            pTVar13 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol_const&>
                                (&this->compilation->super_BumpAllocator,
                                 (EnumValueSymbol *)args.current);
            insertMember(this,&pTVar13->super_Symbol,&at_00->super_Symbol,true,false);
            do {
              args.current = (((EnumValueSymbol *)args.current)->super_ValueSymbol).super_Symbol.
                             nextInScope;
              at_00 = pTVar13;
              this = pSVar14;
              if ((EnumValueSymbol *)args.current == (EnumValueSymbol *)0x0) break;
            } while ((((EnumValueSymbol *)args.current)->super_ValueSymbol).super_Symbol.kind !=
                     EnumValue);
            goto LAB_0026f993;
          }
        }
      }
      else {
        iVar10 = 0x341;
        if ((*(int *)&this_04->field_0x3c < 0) ||
           ((SyntaxNode *)(this_04->typeOrLink).typeSyntax == (SyntaxNode *)0x0)) {
          local_318 = "syntax";
LAB_002709bc:
          assert::assertFailed
                    (local_318,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                     ,iVar10,"void slang::ast::Scope::elaborate() const");
        }
        if (SVar1 != ErrorType) {
          iVar10 = 0x342;
          goto LAB_002709bc;
        }
        local_2c8._8_8_ = 0;
        local_2b8 = (undefined1  [8])0x5;
        local_300 = (Symbol *)CONCAT44(local_300._4_4_,0xffffffff);
        local_2d8 = (AssertionInstanceDetails *)0x0;
        local_2e8 = (TempVarSymbol *)0x0;
        pSStack_2e0 = (Symbol *)0x0;
        local_2f8._0_8_ = 0;
        local_2f8[8] = '\0';
        local_2f8[9] = '\0';
        local_2f8[10] = '\0';
        local_2f8[0xb] = '\0';
        local_2f8[0xc] = '\0';
        local_2f8[0xd] = '\0';
        local_2f8[0xe] = '\0';
        local_2f8[0xf] = '\0';
        local_308 = (undefined1  [8])this;
        local_2c8._0_8_ = &SStack_2b0;
        syntax = slang::syntax::SyntaxNode::as<slang::syntax::EnumTypeSyntax>
                           ((SyntaxNode *)(this_04->typeOrLink).typeSyntax);
        EnumType::createDefaultMembers
                  ((ASTContext *)local_308,syntax,
                   (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8);
        uVar9 = local_2c8._0_8_;
        if (local_2c8._8_8_ != 0) {
          lVar31 = local_2c8._8_8_ << 3;
          lVar32 = 0;
          do {
            pTVar13 = *(TransparentMemberSymbol **)((long)(Compilation **)uVar9 + lVar32);
            insertMember(this,&pTVar13->super_Symbol,&at_00->super_Symbol,true,false);
            lVar32 = lVar32 + 8;
            at_00 = pTVar13;
          } while (lVar31 != lVar32);
        }
        if ((Scope *)local_2c8._0_8_ != &SStack_2b0) {
          free((void *)local_2c8._0_8_);
        }
      }
      ppVar35 = ppVar35 + 1;
    } while (ppVar35 !=
             local_1a0.transparentTypes.
             super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_238 = local_1a0.members.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  this_00 = (ClassType *)this->thisSym;
  SVar1 = (this_00->super_Type).super_Symbol.kind;
  pSVar14 = this;
  if (SVar1 == ClassType) {
    insertCB.callable = (intptr_t)local_2c8;
    insertCB.callback =
         function_ref<void(slang::ast::Symbol_const&)>::
         callback_fn<slang::ast::Scope::elaborate()const::__3>;
    local_2c8._0_8_ = this;
    ClassType::inheritMembers(this_00,insertCB);
  }
  else if ((SVar1 == InstanceBody) &&
          (*(int *)&(this_00->baseConstructorCall).
                    super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
                    super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value
                    [1].field_0x4 == 1)) {
    deferredMembers.size_ =
         (long)local_1a0.members.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_1a0.members.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
    deferredMembers.data_ =
         local_1a0.members.
         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    handleExportedMethods(this,deferredMembers);
  }
  if (local_238 ==
      local_1a0.members.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar23 = 0;
    uVar33 = 0;
  }
  else {
    local_318._0_4_ = 1;
    local_228 = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    local_210 = 
    "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::Symbol *>]"
    ;
    local_218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
    ;
    local_220 = "at";
    local_208 = 0;
    local_230 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)0x0
    ;
    ppSVar27 = local_238;
    this = pSVar14;
    do {
      pSVar19 = *ppSVar27;
      LVar38 = LookupLocation::before(pSVar19);
      local_200._8_4_ = LVar38.index;
      local_200._32_8_ = (TempVarSymbol *)0x0;
      local_200._40_8_ = (Symbol *)0x0;
      local_200._16_8_ = 0;
      local_200._24_8_ = (SourceLocation)0x0;
      local_200._48_8_ = (AssertionInstanceDetails *)0x0;
      local_200._0_8_ = this;
      if (LVar38.scope != this && LVar38.scope != (Scope *)0x0) {
        assert::assertFailed
                  ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                   ,0x119,
                   "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                  );
      }
      if (pSVar19->kind != DeferredMember) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = (anonymous namespace)::DeferredMemberSymbol]"
                  );
      }
      pSVar25 = *(SyntaxNode **)(pSVar19 + 1);
      SVar2 = pSVar25->kind;
      if ((int)SVar2 < 0xd5) {
        if ((int)SVar2 < 0x65) {
          if (0x39 < (int)SVar2) {
            if (SVar2 == CaseGenerate) {
              local_2c8._8_8_ = 0;
              local_2b8 = (undefined1  [8])0x5;
              pCVar3 = this->compilation;
              local_2c8._0_8_ = &SStack_2b0;
              syntax_08 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(pSVar25);
              GenerateBlockSymbol::fromSyntax
                        (pCVar3,syntax_08,(ASTContext *)local_200,(uint32_t)local_318,true,
                         (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)local_2c8);
              uVar9 = local_2c8._0_8_;
              if (pSVar19 == (Symbol *)0x0) {
                assert::assertFailed
                          ("at",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                           ,0x362,
                           "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<slang::ast::GenerateBlockSymbol *>]"
                          );
              }
              pSVar19->indexInScope = pSVar19->indexInScope - (int)local_2c8._8_8_;
              if (local_2c8._8_8_ != 0) {
                lVar32 = local_2c8._8_8_ << 3;
                lVar31 = 0;
                do {
                  pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
                  insertMember(this,pSVar26,pSVar19,true,true);
                  lVar31 = lVar31 + 8;
                  pSVar19 = pSVar26;
                } while (lVar32 != lVar31);
              }
LAB_002703d4:
              if ((Scope *)local_2c8._0_8_ != &SStack_2b0) {
                free((void *)local_2c8._0_8_);
              }
              goto LAB_0027042d;
            }
            if (SVar2 != ClockingItem) goto LAB_00270b8f;
            local_2c8._8_8_ = 0;
            local_2b8 = (undefined1  [8])0x5;
            local_2c8._0_8_ = &SStack_2b0;
            syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::ClockingItemSyntax>(pSVar25);
            ClockVarSymbol::fromSyntax
                      (this,syntax_03,
                       (SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *)local_2c8);
            uVar9 = local_2c8._0_8_;
            if (pSVar19 == (Symbol *)0x0) {
              assert::assertFailed
                        ("at",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,0x362,
                         "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::ClockVarSymbol *>]"
                        );
            }
            pSVar19->indexInScope = pSVar19->indexInScope - (int)local_2c8._8_8_;
            if (local_2c8._8_8_ != 0) {
              lVar32 = local_2c8._8_8_ << 3;
              lVar31 = 0;
              do {
                pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
                insertMember(this,pSVar26,pSVar19,true,true);
                lVar31 = lVar31 + 8;
                pSVar19 = pSVar26;
              } while (lVar32 != lVar31);
            }
            goto LAB_0027052c;
          }
          if (SVar2 == AnsiPortList) {
LAB_0026ff89:
            local_308 = (undefined1  [8])(local_2f8 + 8);
            local_300 = (Symbol *)0x0;
            local_2f8._0_8_ = 5;
            local_2c8._8_8_ = 0;
            local_2b8 = (undefined1  [8])0x4;
            local_2c8._0_8_ = &SStack_2b0;
            this_05 = (PortSymbol *)
                      slang::syntax::SyntaxNode::as<slang::syntax::PortListSyntax>
                                (*(SyntaxNode **)(pSVar19 + 1));
            portDeclarations.size_ = (size_type)this;
            portDeclarations.data_ = in_stack_fffffffffffffcd8;
            PortSymbol::fromSyntax
                      (this_05,(PortListSyntax *)this,(Scope *)local_308,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8,
                       (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                        *)local_1a0.portDecls.
                          super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,portDeclarations);
            auVar8 = local_308;
            if (pSVar19 == (Symbol *)0x0) {
              iVar10 = 0x362;
LAB_00270a4b:
              assert::assertFailed(local_220,local_218,iVar10,local_210);
            }
            pSVar19->indexInScope = pSVar19->indexInScope - (int)local_300;
            src = extraout_RDX;
            if (local_300 != (Symbol *)0x0) {
              lVar32 = (long)local_300 << 3;
              lVar31 = 0;
              do {
                pSVar26 = *(Symbol **)((long)(Compilation **)auVar8 + lVar31);
                insertMember(this,pSVar26,pSVar19,true,true);
                lVar31 = lVar31 + 8;
                src = extraout_RDX_00;
                pSVar19 = pSVar26;
              } while (lVar32 != lVar31);
            }
            if (local_2c8._8_8_ != 0) {
              ppCVar7 = (Compilation **)local_2c8._0_8_;
              lVar31 = local_2c8._8_8_ * 2;
              pSVar14 = (Scope *)local_2c8._0_8_;
              do {
                insertMember(this,(Symbol *)pSVar14->compilation,pSVar14->thisSym,true,false);
                pSVar14 = (Scope *)&pSVar14->nameMap;
                src = extraout_RDX_01;
              } while (pSVar14 != (Scope *)(ppCVar7 + lVar31));
            }
            pSVar19 = this->thisSym;
            if (pSVar19->kind != InstanceBody) {
              iVar10 = 0xc4;
              local_220 = "T::isKind(kind)";
              local_218 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
              ;
              local_210 = 
              "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::InstanceBodySymbol]";
              goto LAB_00270a4b;
            }
            iVar10 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                               ((SmallVectorBase<const_slang::ast::Symbol_*> *)local_308,
                                (EVP_PKEY_CTX *)this->compilation,src);
            pSVar19[2].parentScope = (Scope *)CONCAT44(extraout_var,iVar10);
            pSVar19[2].nextInScope = extraout_RDX_02;
            if ((Scope *)local_2c8._0_8_ != &SStack_2b0) {
              free((void *)local_2c8._0_8_);
            }
            pSVar14 = (Scope *)(local_2f8 + 8);
            if (local_308 != (undefined1  [8])pSVar14) {
              free((void *)local_308);
              pSVar14 = extraout_RAX;
            }
            local_208 = CONCAT71((int7)((ulong)pSVar14 >> 8),1);
          }
          else {
            if (SVar2 != BindDirective) {
LAB_00270b8f:
              this_07 = (logic_error *)__cxa_allocate_exception(0x10);
              local_140[0] = local_130;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,"");
              plVar22 = (long *)std::__cxx11::string::append((char *)local_140);
              local_1c0._M_dataplus._M_p = (pointer)*plVar22;
              psVar24 = (size_type *)(plVar22 + 2);
              if ((size_type *)local_1c0._M_dataplus._M_p == psVar24) {
                local_1c0.field_2._M_allocated_capacity = *psVar24;
                local_1c0.field_2._8_8_ = plVar22[3];
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              }
              else {
                local_1c0.field_2._M_allocated_capacity = *psVar24;
              }
              local_1c0._M_string_length = plVar22[1];
              *plVar22 = (long)psVar24;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::to_string(&local_120,0x400);
              std::operator+(&local_100,&local_1c0,&local_120);
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_100);
              local_308 = (undefined1  [8])*plVar22;
              pSVar14 = (Scope *)(plVar22 + 2);
              if (local_308 == (undefined1  [8])pSVar14) {
                local_2f8._0_8_ = pSVar14->compilation;
                local_2f8._8_8_ = *(char (*) [8])(plVar22 + 3);
                local_308 = (undefined1  [8])local_2f8;
              }
              else {
                local_2f8._0_8_ = pSVar14->compilation;
              }
              local_300 = (Symbol *)plVar22[1];
              *plVar22 = (long)pSVar14;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              plVar22 = (long *)std::__cxx11::string::append(local_308);
              local_2c8._0_8_ = *plVar22;
              pSVar25 = (SyntaxNode *)(plVar22 + 2);
              if ((SyntaxNode *)local_2c8._0_8_ == pSVar25) {
                local_2b8 = (undefined1  [8])pSVar25->parent;
                SStack_2b0.compilation = *(Compilation **)(plVar22 + 3);
                local_2c8._0_8_ = (SyntaxNode *)local_2b8;
              }
              else {
                local_2b8 = (undefined1  [8])pSVar25->parent;
              }
              local_2c8._8_8_ = plVar22[1];
              *plVar22 = (long)pSVar25;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::logic_error::logic_error(this_07,(string *)local_2c8);
              __cxa_throw(this_07,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::BindDirectiveSyntax>(pSVar25);
            InstanceSymbol::fromBindDirective(this,syntax_01);
          }
        }
        else if ((int)SVar2 < 0x78) {
          if (SVar2 == ContinuousAssign) {
            local_2c8._8_8_ = 0;
            local_2b8 = (undefined1  [8])0x5;
            local_308 = (undefined1  [8])(local_2f8 + 8);
            local_300 = (Symbol *)0x0;
            local_2f8._0_8_ = 5;
            pCVar3 = this->compilation;
            local_2c8._0_8_ = &SStack_2b0;
            syntax_10 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>
                                  (pSVar25);
            ContinuousAssignSymbol::fromSyntax
                      (pCVar3,syntax_10,(ASTContext *)local_200,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_308);
            auVar8 = local_308;
            if (pSVar19 == (Symbol *)0x0) {
              assert::assertFailed
                        ("at",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,0x36b,
                         "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::Symbol *>, implicitNets:auto = slang::SmallVector<const slang::ast::Symbol *>]"
                        );
            }
            pSVar19->indexInScope = pSVar19->indexInScope + ~local_2c8._8_4_;
            if (local_300 != (Symbol *)0x0) {
              lVar32 = (long)local_300 << 3;
              lVar31 = 0;
              pSVar26 = pSVar19;
              do {
                pSVar19 = *(Symbol **)((long)(Compilation **)auVar8 + lVar31);
                insertMember(this,pSVar19,pSVar26,true,false);
                lVar31 = lVar31 + 8;
                pSVar26 = pSVar19;
              } while (lVar32 != lVar31);
            }
            uVar9 = local_2c8._0_8_;
            pSVar19->indexInScope = pSVar19->indexInScope + 1;
            if (local_2c8._8_8_ != 0) {
              lVar32 = local_2c8._8_8_ << 3;
              lVar31 = 0;
              do {
                pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
                insertMember(this,pSVar26,pSVar19,true,true);
                lVar31 = lVar31 + 8;
                pSVar19 = pSVar26;
              } while (lVar32 != lVar31);
            }
            goto LAB_00270518;
          }
          if (SVar2 != DataDeclaration) goto LAB_00270b8f;
          local_2c8._8_8_ = 0;
          local_2b8 = (undefined1  [8])0x5;
          local_2c8._0_8_ = &SStack_2b0;
          pDVar18 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>(pSVar25);
          tryFixupInstances(this,pDVar18,(ASTContext *)local_200,
                            (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8);
          uVar9 = local_2c8._0_8_;
          if (pSVar19 == (Symbol *)0x0) {
            assert::assertFailed
                      ("at",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                       ,0x362,
                       "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::Symbol *>]"
                      );
          }
          pSVar19->indexInScope = pSVar19->indexInScope - (int)local_2c8._8_8_;
          if (local_2c8._8_8_ != 0) {
            lVar32 = local_2c8._8_8_ << 3;
            lVar31 = 0;
            do {
              pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
              insertMember(this,pSVar26,pSVar19,true,true);
              lVar31 = lVar31 + 8;
              pSVar19 = pSVar26;
            } while (lVar32 != lVar31);
          }
LAB_0027052c:
          if ((Scope *)local_2c8._0_8_ != &SStack_2b0) {
            free((void *)local_2c8._0_8_);
          }
        }
        else if (SVar2 == DefaultClockingReference) {
          pCVar3 = this->compilation;
          syntax_05 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultClockingReferenceSyntax>
                                (pSVar25);
          Compilation::noteDefaultClocking(pCVar3,(ASTContext *)local_200,syntax_05);
        }
        else {
          if (SVar2 != DefaultDisableDeclaration) {
            if (SVar2 != GenerateBlock) goto LAB_00270b8f;
            syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::GenerateBlockSyntax>(pSVar25);
            member = GenerateBlockSymbol::fromSyntax(this,syntax_00,(uint32_t)local_318);
            insertMember(this,&member->super_Symbol,pSVar19,true,true);
            goto LAB_0027042d;
          }
          pDVar15 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultDisableDeclarationSyntax>
                              (pSVar25);
          pEVar4 = (pDVar15->expr).ptr;
          if (pEVar4 == (ExpressionSyntax *)0x0) {
LAB_00270a96:
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,local_228);
          }
          iVar10 = Expression::bind((int)pEVar4,(sockaddr *)local_200,0);
          expr = (Expression *)CONCAT44(extraout_var_00,iVar10);
          pTVar12 = (expr->type).ptr;
          if (pTVar12 == (Type *)0x0) {
            local_228 = 
            "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            ;
            goto LAB_00270a96;
          }
          if (pTVar12->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar12);
          }
          if ((pTVar12->canonical->super_Symbol).kind != VoidType) {
            ASTContext::requireBooleanConvertible((ASTContext *)local_200,expr);
          }
          Compilation::noteDefaultDisable(this->compilation,this,expr);
        }
      }
      else if ((int)SVar2 < 0x122) {
        if ((int)SVar2 < 0x10d) {
          if (SVar2 != HierarchyInstantiation) {
            if (SVar2 != IfGenerate) goto LAB_00270b8f;
            local_2c8._8_8_ = 0;
            local_2b8 = (undefined1  [8])0x5;
            pCVar3 = this->compilation;
            local_2c8._0_8_ = &SStack_2b0;
            syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(pSVar25);
            GenerateBlockSymbol::fromSyntax
                      (pCVar3,syntax_02,(ASTContext *)local_200,(uint32_t)local_318,true,
                       (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)local_2c8);
            uVar9 = local_2c8._0_8_;
            if (pSVar19 == (Symbol *)0x0) {
              assert::assertFailed
                        ("at",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,0x362,
                         "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<slang::ast::GenerateBlockSymbol *>]"
                        );
            }
            pSVar19->indexInScope = pSVar19->indexInScope - (int)local_2c8._8_8_;
            if (local_2c8._8_8_ != 0) {
              lVar32 = local_2c8._8_8_ << 3;
              lVar31 = 0;
              do {
                pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
                insertMember(this,pSVar26,pSVar19,true,true);
                lVar31 = lVar31 + 8;
                pSVar19 = pSVar26;
              } while (lVar32 != lVar31);
            }
            goto LAB_002703d4;
          }
          local_2c8._8_8_ = 0;
          local_2b8 = (undefined1  [8])0x5;
          local_308 = (undefined1  [8])(local_2f8 + 8);
          local_300 = (Symbol *)0x0;
          local_2f8._0_8_ = 5;
          pCVar3 = this->compilation;
          local_2c8._0_8_ = &SStack_2b0;
          syntax_07 = slang::syntax::SyntaxNode::as<slang::syntax::HierarchyInstantiationSyntax>
                                (pSVar25);
          InstanceSymbol::fromSyntax
                    (pCVar3,syntax_07,(ASTContext *)local_200,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8,
                     (SmallVectorBase<const_slang::ast::Symbol_*> *)local_308);
          auVar8 = local_308;
          if (pSVar19 == (Symbol *)0x0) {
            assert::assertFailed
                      ("at",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                       ,0x36b,
                       "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::Symbol *>, implicitNets:auto = slang::SmallVector<const slang::ast::Symbol *>]"
                      );
          }
          pSVar19->indexInScope = pSVar19->indexInScope + ~local_2c8._8_4_;
          if (local_300 != (Symbol *)0x0) {
            lVar32 = (long)local_300 << 3;
            lVar31 = 0;
            pSVar26 = pSVar19;
            do {
              pSVar19 = *(Symbol **)((long)(Compilation **)auVar8 + lVar31);
              insertMember(this,pSVar19,pSVar26,true,false);
              lVar31 = lVar31 + 8;
              pSVar26 = pSVar19;
            } while (lVar32 != lVar31);
          }
          uVar9 = local_2c8._0_8_;
          pSVar19->indexInScope = pSVar19->indexInScope + 1;
          if (local_2c8._8_8_ != 0) {
            lVar32 = local_2c8._8_8_ << 3;
            lVar31 = 0;
            do {
              pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
              insertMember(this,pSVar26,pSVar19,true,true);
              lVar31 = lVar31 + 8;
              pSVar19 = pSVar26;
            } while (lVar32 != lVar31);
          }
LAB_00270518:
          if (local_308 != (undefined1  [8])(local_2f8 + 8)) {
            free((void *)local_308);
          }
          goto LAB_0027052c;
        }
        if (SVar2 != LoopGenerate) {
          if (SVar2 != ModportDeclaration) goto LAB_00270b8f;
          local_2c8._8_8_ = 0;
          local_2b8 = (undefined1  [8])0x5;
          local_2c8._0_8_ = &SStack_2b0;
          syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                                (pSVar25);
          ModportSymbol::fromSyntax
                    ((ASTContext *)local_200,syntax_04,
                     (SmallVectorBase<const_slang::ast::ModportSymbol_*> *)local_2c8);
          uVar9 = local_2c8._0_8_;
          if (pSVar19 == (Symbol *)0x0) {
            assert::assertFailed
                      ("at",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                       ,0x362,
                       "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::ModportSymbol *>]"
                      );
          }
          pSVar19->indexInScope = pSVar19->indexInScope - (int)local_2c8._8_8_;
          if (local_2c8._8_8_ != 0) {
            lVar32 = local_2c8._8_8_ << 3;
            lVar31 = 0;
            do {
              pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
              insertMember(this,pSVar26,pSVar19,true,true);
              lVar31 = lVar31 + 8;
              pSVar19 = pSVar26;
            } while (lVar32 != lVar31);
          }
          goto LAB_0027052c;
        }
        pCVar3 = this->compilation;
        syntax_09 = slang::syntax::SyntaxNode::as<slang::syntax::LoopGenerateSyntax>(pSVar25);
        member_00 = GenerateBlockArraySymbol::fromSyntax
                              (pCVar3,syntax_09,pSVar19->indexInScope,(ASTContext *)local_200,
                               (uint32_t)local_318);
        insertMember(this,&member_00->super_Symbol,pSVar19,true,true);
LAB_0027042d:
        local_318._0_4_ = (uint32_t)local_318 + 1;
      }
      else {
        if ((int)SVar2 < 0x15d) {
          if (SVar2 != ModuleDeclaration) {
            if (SVar2 != NonAnsiPortList) goto LAB_00270b8f;
            goto LAB_0026ff89;
          }
        }
        else {
          if (SVar2 == PortDeclaration) goto LAB_00270540;
          if (SVar2 == PrimitiveInstantiation) {
            local_2c8._8_8_ = 0;
            local_2b8 = (undefined1  [8])0x5;
            local_308 = (undefined1  [8])(local_2f8 + 8);
            local_300 = (Symbol *)0x0;
            local_2f8._0_8_ = 5;
            local_2c8._0_8_ = &SStack_2b0;
            syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::PrimitiveInstantiationSyntax>
                                  (pSVar25);
            PrimitiveInstanceSymbol::fromSyntax
                      (syntax_06,(ASTContext *)local_200,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_2c8,
                       (SmallVectorBase<const_slang::ast::Symbol_*> *)local_308);
            auVar8 = local_308;
            if (pSVar19 == (Symbol *)0x0) {
              assert::assertFailed
                        ("at",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                         ,0x36b,
                         "auto slang::ast::Scope::elaborate()::(anonymous class)::operator()(auto &, auto &, const Symbol *) const [members:auto = slang::SmallVector<const slang::ast::Symbol *>, implicitNets:auto = slang::SmallVector<const slang::ast::Symbol *>]"
                        );
            }
            pSVar19->indexInScope = pSVar19->indexInScope + ~local_2c8._8_4_;
            if (local_300 != (Symbol *)0x0) {
              lVar32 = (long)local_300 << 3;
              lVar31 = 0;
              pSVar26 = pSVar19;
              do {
                pSVar19 = *(Symbol **)((long)(Compilation **)auVar8 + lVar31);
                insertMember(this,pSVar19,pSVar26,true,false);
                lVar31 = lVar31 + 8;
                pSVar26 = pSVar19;
              } while (lVar32 != lVar31);
            }
            uVar9 = local_2c8._0_8_;
            pSVar19->indexInScope = pSVar19->indexInScope + 1;
            if (local_2c8._8_8_ != 0) {
              lVar32 = local_2c8._8_8_ << 3;
              lVar31 = 0;
              do {
                pSVar26 = *(Symbol **)((long)(Compilation **)uVar9 + lVar31);
                insertMember(this,pSVar26,pSVar19,true,true);
                lVar31 = lVar31 + 8;
                pSVar19 = pSVar26;
              } while (lVar32 != lVar31);
            }
            goto LAB_00270518;
          }
          if (SVar2 != ProgramDeclaration) goto LAB_00270b8f;
        }
        local_230 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *
                    )CONCAT71((uint7)(uint3)(SVar2 >> 8),1);
      }
LAB_00270540:
      ppSVar27 = ppSVar27 + 1;
    } while (ppSVar27 !=
             local_1a0.members.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
    bVar23 = (byte)local_230;
    uVar33 = local_208;
    pSVar14 = this;
  }
  ppSVar27 = local_238;
  if ((local_238 !=
       local_1a0.members.
       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
       super__Vector_impl_data._M_finish & bVar23) == 1) {
    do {
      if ((*ppSVar27)->kind != DeferredMember) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = (anonymous namespace)::DeferredMemberSymbol]"
                  );
      }
      pSVar25 = *(SyntaxNode **)(*ppSVar27 + 1);
      SVar2 = pSVar25->kind;
      if ((SVar2 == ProgramDeclaration) || (SVar2 == ModuleDeclaration)) {
        syntax_11 = slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>(pSVar25);
        handleNestedDefinition(this,syntax_11);
      }
      ppSVar27 = ppSVar27 + 1;
    } while (ppSVar27 !=
             local_1a0.members.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if (((uVar33 & 1) == 0) &&
     (local_230 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                  local_1a0.portDecls.
                  super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
     pSVar16 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
               local_1a0.portDecls.
               super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_1a0.portDecls.
     super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_1a0.portDecls.
     super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      this_01 = pSVar16->data_;
      if (*(SyntaxKind *)&this_01->second == PortDeclaration) {
        pPVar17 = slang::syntax::SyntaxNode::as<slang::syntax::PortDeclarationSyntax>
                            ((SyntaxNode *)this_01);
        this_08 = &pPVar17->declarators;
        this = pSVar14;
      }
      else {
        pDVar18 = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>
                            ((SyntaxNode *)this_01);
        this_08 = &pDVar18->declarators;
        this = pSVar14;
      }
      uVar33 = (this_08->elements).size_ + 1;
      if (1 < uVar33) {
        index = 0;
        do {
          this_06 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator[]
                              (this_08,index);
          sVar39 = parsing::Token::valueText(&this_06->name);
          if (sVar39._M_len != 0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(&this_06->super_SyntaxNode);
            pDVar21 = addDiag(this,(DiagCode)0x990006,sourceRange);
            Diagnostic::operator<<(pDVar21,sVar39);
            break;
          }
          index = index + 1;
        } while (uVar33 >> 1 != index);
      }
      pSVar16 = (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
                &pSVar16->cap;
      pSVar14 = this;
    } while (pSVar16 != local_230);
  }
  if ((local_1a0.members.
       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
       super__Vector_impl_data._M_finish != local_238) &&
     (pSVar19 = this->firstMember, pSVar19 != (Symbol *)0x0)) {
    pSVar26 = this->lastMember;
    pSVar28 = (Symbol *)0x0;
    do {
      pSVar29 = pSVar19;
      if (pSVar19->kind == DeferredMember) {
        ppSVar30 = &pSVar28->nextInScope;
        if (pSVar28 == (Symbol *)0x0) {
          ppSVar30 = &this->firstMember;
        }
        *ppSVar30 = pSVar19->nextInScope;
        pSVar29 = pSVar28;
        if (pSVar26 == pSVar19) {
          pSVar26 = pSVar19->nextInScope;
          this->lastMember = pSVar26;
        }
      }
      pSVar19 = pSVar19->nextInScope;
      pSVar28 = pSVar29;
    } while (pSVar19 != (Symbol *)0x0);
  }
  local_268 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
               *)local_2c8;
  local_260.
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>
  .storage = local_268;
  local_260.entries =
       ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>();
  local_260.num_slots_minus_one = 0;
  local_260.hash_policy.shift = '?';
  local_260.max_lookups = '\x03';
  local_260._max_load_factor = 0.5;
  local_260.num_elements = 0;
  for (ppFVar34 = local_1a0.forwardingTypedefs.
                  super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppFVar34 !=
      local_1a0.forwardingTypedefs.
      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppFVar34 = ppFVar34 + 1) {
    pFVar5 = *ppFVar34;
    if ((pFVar5->super_Symbol).name._M_len != 0) {
      key = &(pFVar5->super_Symbol).name;
      pVar40 = ska::detailv3::
               sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
               ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                         ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,4ul>>
                           *)&local_260,key);
      if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar20 = ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                 ::find(&pSVar14->nameMap->
                         super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                        ,key);
        pSVar6 = pSVar14->nameMap;
        if (iVar20.current ==
            (pSVar6->
            super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
            ).entries +
            (pSVar6->
            super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
            ).num_slots_minus_one +
            (long)(pSVar6->
                  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
                  ).max_lookups) {
          assert::assertFailed
                    ("it != nameMap->end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
                     ,0x442,"void slang::ast::Scope::elaborate() const");
        }
        this_02 = (GenericClassDefSymbol *)((iVar20.current)->field_1).value.second;
        SVar1 = (this_02->super_Symbol).kind;
        if (SVar1 == ClassType) {
          ClassType::checkForwardDecls((ClassType *)this_02);
        }
        else if (SVar1 == GenericClassDef) {
          GenericClassDefSymbol::checkForwardDecls(this_02);
        }
        else if (SVar1 == TypeAlias) {
          TypeAliasType::checkForwardDecls((TypeAliasType *)this_02);
        }
        else {
          pDVar21 = addDiag(pSVar14,(DiagCode)0x37000a,(pFVar5->super_Symbol).location);
          Diagnostic::operator<<(pDVar21,(pFVar5->super_Symbol).name);
        }
      }
    }
  }
  this_03 = (StatementBlockSymbol *)pSVar14->thisSym;
  if ((this_03->super_Symbol).kind == StatementBlock) {
    local_200._0_8_ = (Scope *)0x0;
    if ((this_03->super_Symbol).kind != StatementBlock) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,
                 "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::StatementBlockSymbol]");
    }
    local_300 = (Symbol *)local_200;
    insertCB_00.callable = (intptr_t)local_308;
    insertCB_00.callback =
         function_ref<void(slang::ast::Symbol_const&)>::
         callback_fn<slang::ast::Scope::elaborate()const::__4>;
    local_308 = (undefined1  [8])pSVar14;
    StatementBlockSymbol::elaborateVariables(this_03,insertCB_00);
  }
  if (*(DeferredMemberIndex *)&local_1c8->parent == Invalid) {
    if ((pSVar14->thisSym->kind == InstanceBody) && (TimeTrace::profiler != 0)) {
      TimeTrace::endTrace();
    }
    ska::detailv3::
    sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_4UL>_>
    ::~sherwood_v3_table(&local_260);
    ska::detailv3::
    sherwood_v3_table<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::SyntaxNode_*,_std::hash<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::SyntaxNode_*>,_8UL>_>
    ::~sherwood_v3_table(&local_58);
    if ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
        local_1a0.portDecls.
        super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)0x0) {
      operator_delete(local_1a0.portDecls.
                      super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.portDecls.
                            super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.portDecls.
                            super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a0.forwardingTypedefs.
        super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.forwardingTypedefs.
                      super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.forwardingTypedefs.
                            super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.forwardingTypedefs.
                            super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a0.transparentTypes.
        super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.transparentTypes.
                      super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.transparentTypes.
                            super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.transparentTypes.
                            super__Vector_base<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a0.members.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.members.
                      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.members.
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.members.
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  assert::assertFailed
            ("deferredMemberIndex == DeferredMemberIndex::Invalid",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Scope.cpp"
             ,0x458,"void slang::ast::Scope::elaborate() const");
}

Assistant:

void Scope::elaborate() const {
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled()) {
        TimeTrace::beginTrace("elaborate scope"sv, [&] {
            std::string buffer;
            thisSym->getHierarchicalPath(buffer);
            return buffer;
        });
    }

    ASSERT(deferredMemberIndex != DeferredMemberIndex::Invalid);
    auto deferredData = compilation.getOrAddDeferredData(deferredMemberIndex);
    deferredMemberIndex = DeferredMemberIndex::Invalid;

    SmallSet<const SyntaxNode*, 8> enumDecls;
    for (const auto& pair : deferredData.getTransparentTypes()) {
        auto insertAt = pair.first;
        auto dt = pair.second->getDeclaredType();

        const Type* type = &dt->getType();
        while (type->isPackedArray())
            type = type->getArrayElementType();

        if (type->kind == SymbolKind::EnumType) {
            if (!type->getSyntax() || enumDecls.insert(type->getSyntax()).second) {
                for (const auto& value : type->as<EnumType>().values()) {
                    auto wrapped = compilation.emplace<TransparentMemberSymbol>(value);
                    insertMember(wrapped, insertAt, true, false);
                    insertAt = wrapped;
                }
            }
        }
        else {
            // If there was an error with the enum definition, we still want to
            // add all of the members into this scope so that we don't get
            // further errors reported.
            auto syntax = dt->getTypeSyntax();
            ASSERT(syntax);
            ASSERT(type->kind == SymbolKind::ErrorType);

            SmallVector<const Symbol*> members;
            ASTContext context(*this, LookupLocation::max);
            EnumType::createDefaultMembers(context, syntax->as<EnumTypeSyntax>(), members);

            for (auto member : members) {
                insertMember(member, insertAt, true, false);
                insertAt = member;
            }
        }
    }

    auto deferred = deferredData.getMembers();

    if (thisSym->kind == SymbolKind::ClassType) {
        // If this is a class type being elaborated, let it inherit members from parent classes.
        thisSym->as<ClassType>().inheritMembers(
            [this](const Symbol& member) { insertMember(&member, nullptr, true, true); });
    }
    else if (thisSym->kind == SymbolKind::InstanceBody &&
             thisSym->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                 DefinitionKind::Interface) {
        // Allow the interface to implicitly declare extern methods for
        // exported subroutines that are only declared in modports.
        handleExportedMethods(deferred);
    }

    auto insertMembers = [this](auto& members, const Symbol* at) {
        // When we originally inserted the DeferredMemberSymbol we made room
        // in the index space for these new members. Back the index up by
        // the number of new members to make sure we insert in order.
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size();
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    auto insertMembersAndNets = [this](auto& members, auto& implicitNets, const Symbol* at) {
        ASSERT(at);
        at->indexInScope -= (uint32_t)members.size() + 1;
        for (auto net : implicitNets) {
            insertMember(net, at, true, false);
            at = net;
        }

        at->indexInScope += 1;
        for (auto member : members) {
            insertMember(member, at, true, true);
            at = member;
        }
    };

    // Go through deferred instances and elaborate them now.
    bool usedPorts = false;
    bool hasNestedDefs = false;
    uint32_t constructIndex = 1;

    for (auto symbol : deferred) {
        ASTContext context(*this, LookupLocation::before(*symbol));
        auto& member = symbol->as<DeferredMemberSymbol>();

        switch (member.node.kind) {
            case SyntaxKind::HierarchyInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                InstanceSymbol::fromSyntax(compilation,
                                           member.node.as<HierarchyInstantiationSyntax>(), context,
                                           instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::PrimitiveInstantiation: {
                SmallVector<const Symbol*> instances;
                SmallVector<const Symbol*> implicitNets;
                PrimitiveInstanceSymbol::fromSyntax(member.node.as<PrimitiveInstantiationSyntax>(),
                                                    context, instances, implicitNets);
                insertMembersAndNets(instances, implicitNets, symbol);
                break;
            }
            case SyntaxKind::IfGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<IfGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::CaseGenerate: {
                SmallVector<GenerateBlockSymbol*> blocks;
                GenerateBlockSymbol::fromSyntax(compilation, member.node.as<CaseGenerateSyntax>(),
                                                context, constructIndex, true, blocks);
                constructIndex++;
                insertMembers(blocks, symbol);
                break;
            }
            case SyntaxKind::LoopGenerate:
                insertMember(&GenerateBlockArraySymbol::fromSyntax(
                                 compilation, member.node.as<LoopGenerateSyntax>(),
                                 symbol->getIndex(), context, constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::GenerateBlock:
                // This case is invalid according to the spec but the parser only issues a warning
                // since some existing code does this anyway.
                insertMember(&GenerateBlockSymbol::fromSyntax(
                                 *this, member.node.as<GenerateBlockSyntax>(), constructIndex),
                             symbol, true, true);
                constructIndex++;
                break;
            case SyntaxKind::AnsiPortList:
            case SyntaxKind::NonAnsiPortList: {
                SmallVector<const Symbol*> ports;
                SmallVector<std::pair<Symbol*, const Symbol*>, 4> implicitMembers;
                PortSymbol::fromSyntax(member.node.as<PortListSyntax>(), *this, ports,
                                       implicitMembers, deferredData.getPortDeclarations());
                insertMembers(ports, symbol);

                for (auto [implicitMember, insertionPoint] : implicitMembers)
                    insertMember(implicitMember, insertionPoint, true, false);

                // Let the instance know its list of ports. This is kind of annoying because it
                // inverts the dependency tree but it's better than giving all symbols a virtual
                // method just for this.
                asSymbol().as<InstanceBodySymbol>().setPorts(ports.copy(compilation));
                usedPorts = true;
                break;
            }
            case SyntaxKind::ContinuousAssign: {
                SmallVector<const Symbol*> symbols;
                SmallVector<const Symbol*> implicitNets;
                ContinuousAssignSymbol::fromSyntax(compilation,
                                                   member.node.as<ContinuousAssignSyntax>(),
                                                   context, symbols, implicitNets);
                insertMembersAndNets(symbols, implicitNets, symbol);
                break;
            }
            case SyntaxKind::ModportDeclaration: {
                SmallVector<const ModportSymbol*> results;
                ModportSymbol::fromSyntax(context, member.node.as<ModportDeclarationSyntax>(),
                                          results);
                insertMembers(results, symbol);
                break;
            }
            case SyntaxKind::BindDirective:
                InstanceSymbol::fromBindDirective(*this, member.node.as<BindDirectiveSyntax>());
                break;
            case SyntaxKind::ClockingItem: {
                SmallVector<const ClockVarSymbol*> vars;
                ClockVarSymbol::fromSyntax(*this, member.node.as<ClockingItemSyntax>(), vars);
                insertMembers(vars, symbol);
                break;
            }
            case SyntaxKind::DefaultClockingReference: {
                // No symbol to create here; instead, try to look up the clocking block
                // and register it as a default.
                compilation.noteDefaultClocking(context,
                                                member.node.as<DefaultClockingReferenceSyntax>());
                break;
            }
            case SyntaxKind::DefaultDisableDeclaration: {
                // No symbol to create here; instead, bind the expression and hand it
                // off to the compilation for tracking.
                auto& expr = Expression::bind(
                    *member.node.as<DefaultDisableDeclarationSyntax>().expr, context);

                if (!expr.type->isVoid())
                    context.requireBooleanConvertible(expr);

                compilation.noteDefaultDisable(*this, expr);
                break;
            }
            case SyntaxKind::PortDeclaration:
                // Nothing to do here, handled by port creation.
                break;
            case SyntaxKind::DataDeclaration: {
                SmallVector<const Symbol*> instances;
                tryFixupInstances(member.node.as<DataDeclarationSyntax>(), context, instances);
                insertMembers(instances, symbol);
                break;
            }
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::ProgramDeclaration:
                // These have to wait until we've seen all instantiations.
                hasNestedDefs = true;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    // If there are nested definitions, go back through and find ones that
    // need to be implicitly instantiated.
    if (hasNestedDefs) {
        for (auto symbol : deferred) {
            auto& member = symbol->as<DeferredMemberSymbol>();
            if (member.node.kind == SyntaxKind::ModuleDeclaration ||
                member.node.kind == SyntaxKind::ProgramDeclaration) {
                handleNestedDefinition(member.node.as<ModuleDeclarationSyntax>());
            }
        }
    }

    // Issue an error if port I/Os were declared but the module doesn't have a port list.
    if (!usedPorts) {
        for (auto [syntax, symbol] : deferredData.getPortDeclarations()) {
            auto& declarators = syntax->kind == SyntaxKind::PortDeclaration
                                    ? syntax->as<PortDeclarationSyntax>().declarators
                                    : syntax->as<DataDeclarationSyntax>().declarators;
            for (auto decl : declarators) {
                // We'll report an error for just the first decl in each syntax entry,
                // because it should be clear to the user that there aren't any ports
                // at all in the module header.
                auto name = decl->name.valueText();
                if (!name.empty()) {
                    addDiag(diag::UnusedPortDecl, decl->sourceRange()) << name;
                    break;
                }
            }
        }
    }

    // Finally unlink any deferred members we had; we no longer need them.
    if (!deferred.empty()) {
        const Symbol* symbol = firstMember;
        const Symbol* prev = nullptr;

        while (symbol) {
            if (symbol->kind == SymbolKind::DeferredMember) {
                if (prev)
                    prev->nextInScope = symbol->nextInScope;
                else
                    firstMember = symbol->nextInScope;

                if (lastMember == symbol)
                    lastMember = symbol->nextInScope;
            }
            else {
                prev = symbol;
            }
            symbol = symbol->nextInScope;
        }
    }

    SmallSet<string_view, 4> observedForwardDecls;
    for (auto symbol : deferredData.getForwardingTypedefs()) {
        // Ignore duplicate entries.
        if (symbol->name.empty() || !observedForwardDecls.emplace(symbol->name).second)
            continue;

        // Try to do a lookup by name; if the program is well-formed we'll find the
        // corresponding full typedef. If we don't, issue an error.
        auto it = nameMap->find(symbol->name);
        ASSERT(it != nameMap->end());

        if (it->second->kind == SymbolKind::TypeAlias)
            it->second->as<TypeAliasType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::ClassType)
            it->second->as<ClassType>().checkForwardDecls();
        else if (it->second->kind == SymbolKind::GenericClassDef)
            it->second->as<GenericClassDefSymbol>().checkForwardDecls();
        else
            addDiag(diag::UnresolvedForwardTypedef, symbol->location) << symbol->name;
    }

    // Allow statement blocks containing variables to include them in their member
    // list before allowing anyone else to access the contained statements.
    if (thisSym->kind == SymbolKind::StatementBlock) {
        const Symbol* at = nullptr;
        thisSym->as<StatementBlockSymbol>().elaborateVariables([this, &at](const Symbol& member) {
            insertMember(&member, at, true, false);
            at = &member;
        });
    }

    ASSERT(deferredMemberIndex == DeferredMemberIndex::Invalid);
    if (thisSym->kind == SymbolKind::InstanceBody && TimeTrace::isEnabled())
        TimeTrace::endTrace();
}